

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

QString * __thiscall QFont::toString(QString *__return_storage_ptr__,QFont *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_2130;
  QArrayDataPointer<char16_t> local_2118;
  QArrayDataPointer<char16_t> local_2100;
  QArrayDataPointer<char16_t> local_20e8;
  QArrayDataPointer<char16_t> local_20d0;
  QArrayDataPointer<char16_t> local_20b8;
  QArrayDataPointer<char16_t> local_20a0;
  QArrayDataPointer<char16_t> local_2088;
  QArrayDataPointer<char16_t> local_2070;
  QArrayDataPointer<char16_t> local_2058;
  QArrayDataPointer<char16_t> local_2040;
  QArrayDataPointer<char16_t> local_2028;
  QArrayDataPointer<char16_t> local_2010;
  QArrayDataPointer<char16_t> local_1ff8;
  QArrayDataPointer<char16_t> local_1fe0;
  QArrayDataPointer<char16_t> local_1fc8;
  QStringBuilder<QString,_const_QChar_&> local_1fa8;
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> local_1f88;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1f50;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1f10;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1eb8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1e58;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1de0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1d60;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1cc8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1c28;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1b70;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1ab0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_19d8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_18f8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1800;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1700;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_15e8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_14c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1390;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1250;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_10f8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_f98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_e20;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_ca0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_b08;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_968;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_7b0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_5f0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_418;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_238;
  QChar local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3a.ucs = L',';
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  family((QString *)&local_1fc8,this);
  local_1fa8.a.d.size = local_1fc8.size;
  local_1fa8.a.d.ptr = local_1fc8.ptr;
  local_1fa8.a.d.d = local_1fc8.d;
  local_1fc8.d = (Data *)0x0;
  local_1fc8.ptr = (char16_t *)0x0;
  local_1fc8.size = 0;
  local_1fa8.b = &local_3a;
  QString::number((((this->d).d.ptr)->request).pointSize,(char)&local_1fe0,0x67);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::QStringBuilder
            (&local_1f88,&local_1fa8,(QString *)&local_1fe0);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::QStringBuilder
            (&local_1f50.a,&local_1f88);
  local_1f50.b = &local_3a;
  QString::number((int)&local_1ff8,(int)(((this->d).d.ptr)->request).pixelSize);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1f10,&local_1f50,(QString *)&local_1ff8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1eb8.a,&local_1f10);
  local_1eb8.b = &local_3a;
  QString::number((int)&local_2010,(uint)(byte)(((this->d).d.ptr)->request).field_0x64);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1e58,&local_1eb8,(QString *)&local_2010);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1de0.a,&local_1e58);
  local_1de0.b = &local_3a;
  QString::number((int)&local_2028,
                  (uint)((ulong)*(undefined8 *)&(((this->d).d.ptr)->request).field_0x60 >> 0x28) &
                  0x3ff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1d60,&local_1de0,(QString *)&local_2028);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1cc8.a,&local_1d60);
  local_1cc8.b = &local_3a;
  QString::number((int)&local_2040,*(uint *)&(((this->d).d.ptr)->request).field_0x60 >> 0x1c & 3);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1c28,&local_1cc8,(QString *)&local_2040);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1b70.a,&local_1c28);
  local_1b70.b = &local_3a;
  QString::number((int)&local_2058,(byte)((this->d).d.ptr)->field_0x7c & 1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1ab0,&local_1b70,(QString *)&local_2058);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_19d8.a,&local_1ab0);
  local_19d8.b = &local_3a;
  QString::number((int)&local_2070,*(uint *)&((this->d).d.ptr)->field_0x7c >> 2 & 1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_18f8,&local_19d8,(QString *)&local_2070);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1800.a,&local_18f8);
  local_1800.b = &local_3a;
  QString::number((int)&local_2088,
                  (uint)((ulong)*(undefined8 *)&(((this->d).d.ptr)->request).field_0x60 >> 0x32) & 1
                 );
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1700,&local_1800,(QString *)&local_2088);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_15e8.a,&local_1700);
  local_15e8.b = &local_3a;
  QString::number((int)&local_20a0,0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_14c8,&local_15e8,(QString *)&local_20a0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1390.a,&local_14c8);
  local_1390.b = &local_3a;
  QString::number((int)&local_20b8,*(uint *)&((this->d).d.ptr)->field_0x7c >> 4 & 7);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1250,&local_1390,(QString *)&local_20b8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_10f8.a,&local_1250);
  local_10f8.b = &local_3a;
  QString::number((int)&local_20d0,(uint)((byte)((this->d).d.ptr)->field_0x7c >> 7));
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_f98,&local_10f8,(QString *)&local_20d0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_e20.a,&local_f98);
  local_e20.b = &local_3a;
  QString::number((double)(((this->d).d.ptr)->letterSpacing).val * 0.015625,(char)&local_20e8,0x67);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_ca0,&local_e20,(QString *)&local_20e8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_b08.a,&local_ca0);
  local_b08.b = &local_3a;
  QString::number((double)(((this->d).d.ptr)->wordSpacing).val * 0.015625,'\0',0x67);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_968,&local_b08,(QString *)&local_2100);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_7b0.a,&local_968);
  local_7b0.b = &local_3a;
  QString::number((int)&local_2118,*(ushort *)&(((this->d).d.ptr)->request).field_0x62 & 0xfff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_5f0,&local_7b0,(QString *)&local_2118);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_418.a,&local_5f0);
  local_418.b = &local_3a;
  QString::number((int)&local_2130,(uint)*(ushort *)&(((this->d).d.ptr)->request).field_0x60);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_238,&local_418,(QString *)&local_2130);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::convertTo<QString>(__return_storage_ptr__,&local_238);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_238);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2130);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_418.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_5f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2118);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_7b0.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_968);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2100);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_b08.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_ca0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20e8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_e20.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_f98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20d0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_10f8.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1250);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20b8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1390.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_14c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20a0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_15e8.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1700);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2088);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1800.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_18f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2070);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_19d8.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1ab0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2058);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1b70.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1c28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2040);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1cc8.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1d60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2028);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1de0.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1e58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2010);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1eb8.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1f10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1ff8);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder(&local_1f50.a);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder(&local_1f88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1fe0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1fa8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1fc8);
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.size =
       (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d =
       (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.ptr =
       (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  styleName((QString *)&local_238,this);
  if ((undefined1 *)local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.size !=
      (undefined1 *)0x0) {
    local_418.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d = (Data *)&local_3a;
    local_418.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.ptr =
         (char16_t *)&local_238;
    ::operator+=(__return_storage_ptr__,(QStringBuilder<const_QChar_&,_QString_&> *)&local_418);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFont::toString() const
{
    const QChar comma(u',');
    QString fontDescription = family() + comma +
        QString::number(     pointSizeF()) + comma +
        QString::number(      pixelSize()) + comma +
        QString::number((int) styleHint()) + comma +
        QString::number(         weight()) + comma +
        QString::number((int)     style()) + comma +
        QString::number((int) underline()) + comma +
        QString::number((int) strikeOut()) + comma +
        QString::number((int)fixedPitch()) + comma +
        QString::number((int)   false) + comma +
        QString::number((int)capitalization()) + comma +
        QString::number((int)letterSpacingType()) + comma +
        QString::number(letterSpacing()) + comma +
        QString::number(wordSpacing()) + comma +
        QString::number(stretch()) + comma +
        QString::number((int)styleStrategy());

    QString fontStyle = styleName();
    if (!fontStyle.isEmpty())
        fontDescription += comma + fontStyle;

    return fontDescription;
}